

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getNu(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters local_118;
  
  getZhouParam(&local_118,this);
  ZhouParameters::~ZhouParameters(&local_118);
  return local_118.nu;
}

Assistant:

RealType EAMAdapter::getNu() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.nu;
  }